

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O2

JL_STATUS JlSetObjectNumberString(JlDataObject *NumberObject,char *NumberString)

{
  _Bool _Var1;
  int iVar2;
  JL_STATUS JVar3;
  uint64_t u64;
  char newString [32];
  
  newString[0x10] = '\0';
  newString[0x11] = '\0';
  newString[0x12] = '\0';
  newString[0x13] = '\0';
  newString[0x14] = '\0';
  newString[0x15] = '\0';
  newString[0x16] = '\0';
  newString[0x17] = '\0';
  newString[0x18] = '\0';
  newString[0x19] = '\0';
  newString[0x1a] = '\0';
  newString[0x1b] = '\0';
  newString[0x1c] = '\0';
  newString[0x1d] = '\0';
  newString[0x1e] = '\0';
  newString[0x1f] = '\0';
  newString[0] = '\0';
  newString[1] = '\0';
  newString[2] = '\0';
  newString[3] = '\0';
  newString[4] = '\0';
  newString[5] = '\0';
  newString[6] = '\0';
  newString[7] = '\0';
  newString[8] = '\0';
  newString[9] = '\0';
  newString[10] = '\0';
  newString[0xb] = '\0';
  newString[0xc] = '\0';
  newString[0xd] = '\0';
  newString[0xe] = '\0';
  newString[0xf] = '\0';
  if (NumberString == (char *)0x0 || NumberObject == (JlDataObject *)0x0) {
    return JL_STATUS_INVALID_PARAMETER;
  }
  u64 = 0;
  if ((*NumberString == '0') && ((byte)(NumberString[1] | 0x20U) == 0x78)) {
    iVar2 = __isoc99_sscanf(NumberString,"%lx",&u64);
    if (iVar2 == 1) {
      _Var1 = true;
      JVar3 = JL_STATUS_WRONG_TYPE;
      if (NumberObject->Type == JL_DATA_TYPE_NUMBER) {
LAB_00101814:
        (NumberObject->field_2).Number.Type = JL_NUM_TYPE_UNSIGNED;
        (NumberObject->field_2).Number.IsHex = _Var1;
        (NumberObject->field_2).Number.field_1.u64 = u64;
        return JL_STATUS_SUCCESS;
      }
    }
    else {
      JVar3 = JL_STATUS_INVALID_DATA;
    }
  }
  else {
    iVar2 = __isoc99_sscanf(NumberString,"%lu",&u64);
    JVar3 = JL_STATUS_INVALID_DATA;
    if (iVar2 == 1) {
      sprintf(newString,"%lu",u64);
      iVar2 = strcmp(NumberString,newString);
      if ((iVar2 == 0) && (JVar3 = JL_STATUS_WRONG_TYPE, NumberObject->Type == JL_DATA_TYPE_NUMBER))
      {
        _Var1 = false;
        goto LAB_00101814;
      }
    }
  }
  u64 = 0;
  iVar2 = __isoc99_sscanf(NumberString,"%ld");
  if (iVar2 == 1) {
    sprintf(newString,"%ld",u64);
    iVar2 = strcmp(NumberString,newString);
    if (iVar2 == 0) {
      if (NumberObject->Type == JL_DATA_TYPE_NUMBER) {
        (NumberObject->field_2).Number.Type = JL_NUM_TYPE_SIGNED;
        goto LAB_00101984;
      }
      JVar3 = JL_STATUS_WRONG_TYPE;
    }
  }
  u64 = 0;
  iVar2 = __isoc99_sscanf(NumberString,"%lg");
  if ((iVar2 == 1) &&
     ((u64 & 0x7fffffffffffffff) - 1 < 0xfffffffffffff ||
      (uint)((u64 & 0x7fffffffffffffff) + 0xfff0000000000000 >> 0x35) < 0x3ff)) {
    if (NumberObject->Type == JL_DATA_TYPE_NUMBER) {
      (NumberObject->field_2).Number.Type = JL_NUM_TYPE_FLOAT;
      (NumberObject->field_2).Number.field_1.u64 = u64;
      return JL_STATUS_SUCCESS;
    }
    JVar3 = JL_STATUS_WRONG_TYPE;
  }
  iVar2 = strcasecmp(NumberString,"inf");
  if ((iVar2 == 0) || (iVar2 = strcasecmp(NumberString,"+inf"), iVar2 == 0)) {
    if (NumberObject->Type != JL_DATA_TYPE_NUMBER) {
      return JL_STATUS_WRONG_TYPE;
    }
    (NumberObject->field_2).Number.Type = JL_NUM_TYPE_FLOAT;
    u64 = 0x7ff0000000000000;
  }
  else {
    iVar2 = strcasecmp(NumberString,"-inf");
    if (iVar2 == 0) {
      if (NumberObject->Type == JL_DATA_TYPE_NUMBER) {
        (NumberObject->field_2).Number.Type = JL_NUM_TYPE_FLOAT;
        (NumberObject->field_2).Number.field_1.u64 = 0xfff0000000000000;
        return JL_STATUS_SUCCESS;
      }
      return JL_STATUS_WRONG_TYPE;
    }
    iVar2 = strcasecmp(NumberString,"nan");
    if (iVar2 != 0) {
      return JVar3;
    }
    if (NumberObject->Type != JL_DATA_TYPE_NUMBER) {
      return JL_STATUS_WRONG_TYPE;
    }
    (NumberObject->field_2).Number.Type = JL_NUM_TYPE_FLOAT;
    u64 = 0x7fffffffffffffff;
  }
LAB_00101984:
  (NumberObject->field_2).Number.field_1.u64 = u64;
  return JL_STATUS_SUCCESS;
}

Assistant:

JL_STATUS
    JlSetObjectNumberString
    (
        JlDataObject*   NumberObject,
        char const*     NumberString
    )
{
    JL_STATUS jlStatus;
    int converted;
    char newString [32] = "";

    if(     NULL != NumberObject
        &&  NULL != NumberString )
    {
        jlStatus = JL_STATUS_INVALID_DATA;

        if( JL_STATUS_SUCCESS != jlStatus )
        {
            // Try to convert the number as u64 first
            uint64_t u64 = 0;
            if( '0' == NumberString[0] && ( 'x' == NumberString[1] || 'X' == NumberString[1] ) )
            {
                // Hex
                converted = sscanf( NumberString, "%"PRIx64"", &u64 );
                if( 1 == converted )
                {
                    // Note: We don't check the exact string match in hex mode because the source
                    // string may be padded eg: 0x0001
                    jlStatus = JlSetObjectNumberHex( NumberObject, u64 );
                }
            }
            else
            {
                // Decimal
                converted = sscanf( NumberString, "%"PRIu64"", &u64 );
                if( 1 == converted )
                {
                    sprintf( newString, "%"PRIu64"", u64 );
                    if( strcmp( NumberString, newString ) == 0 )
                    {
                        jlStatus = JlSetObjectNumberU64( NumberObject, u64 );
                    }
                }
            }
        }

        if( JL_STATUS_SUCCESS != jlStatus )
        {
            // Try to convert the number as a signed 64 bit number
            int64_t s64 = 0;
            converted = sscanf( NumberString, "%"PRId64"", &s64 );
            if( 1 == converted )
            {
                sprintf( newString, "%"PRId64"", s64 );
                if( strcmp( NumberString, newString ) == 0 )
                {
                    jlStatus = JlSetObjectNumberS64( NumberObject, s64 );
                }
            }

        }

        if( JL_STATUS_SUCCESS != jlStatus )
        {
            // Try to convert the number as a float
            double f64 = 0.0;
            converted = sscanf( NumberString, "%lg", &f64 );
            if( 1 == converted )
            {
                double a_inf = DBL_MAX * 2.0;
                double a_ninf = DBL_MAX * -2.0;

                if(     0.0 != f64
                    &&  !isnan( f64 )
                    &&  a_inf != f64
                    &&  a_ninf != f64 )
                {
                    jlStatus = JlSetObjectNumberF64( NumberObject, f64 );
                }
            }
        }

        if( JL_STATUS_SUCCESS != jlStatus )
        {
            // Try to convert as inf, +inf, -inf, or nan
            if( strcasecmp( NumberString, "inf" ) == 0 || strcasecmp( NumberString, "+inf" ) == 0 )
            {
                double a_inf = DBL_MAX * 2.0;
                jlStatus = JlSetObjectNumberF64( NumberObject, a_inf );
            }
            else if( strcasecmp( NumberString, "-inf" ) == 0 )
            {
                double a_ninf = DBL_MAX * -2.0;
                jlStatus = JlSetObjectNumberF64( NumberObject, a_ninf );
            }
            else if( strcasecmp( NumberString, "nan" ) == 0 )
            {
                union
                {
                    uint64_t    bits;
                    double      f64;
                } a_nan = { 0x7fffffffffffffffULL };      // Set all bits except sign to make a NaN

                jlStatus = JlSetObjectNumberF64( NumberObject, a_nan.f64 );
            }
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}